

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::CmdLine::declare_arg
               (string *name,ArgType type,string *default_value,string *description,ArgFlags flags)

{
  _Link_type __rhs;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  iterator iVar6;
  ostream *poVar7;
  iterator iVar8;
  _Rb_tree_node_base *this;
  ulong uVar9;
  _Rb_tree_node_base *p_Var10;
  Environment *pEVar11;
  long lVar12;
  iterator iVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  _Base_ptr p_Var14;
  _Link_type p_Var15;
  _Link_type __p;
  _Link_type __rhs_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
  *this_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar16;
  allocator local_e1;
  _Link_type local_e0;
  long local_d8;
  _Link_type local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
  *local_c8;
  string *local_c0;
  Arg arg;
  string group;
  string local_50;
  
  iVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
          ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                  *)(::(anonymous_namespace)::desc_ + 0x20),name);
  if (iVar6._M_node != (_Base_ptr)(::(anonymous_namespace)::desc_ + 0x28)) {
    std::__cxx11::string::string((string *)&arg,"CmdLine",(allocator *)&group);
    poVar7 = Logger::err(&arg.name);
    poVar7 = std::operator<<(poVar7,"Argument is multiply defined: ");
    poVar7 = std::operator<<(poVar7,(string *)name);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&arg);
    return;
  }
  arg.name._M_dataplus._M_p = (pointer)&arg.name.field_2;
  arg.name._M_string_length = 0;
  __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  arg.name.field_2._M_local_buf[0] = '\0';
  arg.desc._M_dataplus._M_p = (pointer)&arg.desc.field_2;
  arg.desc._M_string_length = 0;
  arg.desc.field_2._M_local_buf[0] = '\0';
  local_c0 = default_value;
  std::__cxx11::string::_M_assign((string *)&arg);
  arg.type = type;
  std::__cxx11::string::_M_assign((string *)&arg.desc);
  lVar12 = ::(anonymous_namespace)::desc_;
  p_Var15 = (_Link_type)(::(anonymous_namespace)::desc_ + 0x28);
  arg.flags = flags;
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
          ::_M_lower_bound(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                             **)(::(anonymous_namespace)::desc_ + 0x30),p_Var15,(_Base_ptr)name,__k)
  ;
  pVar1.second = iVar8._M_node;
  pVar1.first = iVar8._M_node;
  if (((_Link_type)iVar8._M_node != p_Var15) &&
     (bVar5 = std::operator<(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(iVar8._M_node + 1)), !bVar5)) goto LAB_00140c09;
  this = (_Rb_tree_node_base *)operator_new(0x88);
  __rhs_00 = (_Link_type)(this + 1);
  std::__cxx11::string::string((string *)__rhs_00,(string *)name);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
             *)(lVar12 + 0x20);
  *(undefined8 *)(this + 4) = 0;
  this[2]._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)(this + 3) = 0;
  this[3]._M_parent = (_Base_ptr)0x0;
  this[3]._M_left = (_Base_ptr)0x0;
  this[3]._M_right = (_Base_ptr)0x0;
  this[2]._M_left = (_Base_ptr)0x0;
  this[2]._M_right = (_Base_ptr)0x0;
  *(_Base_ptr **)(this + 2) = &this[2]._M_left;
  *(_Base_ptr **)(this + 3) = &this[3]._M_left;
  if ((_Link_type)iVar8._M_node == p_Var15) {
    local_e0 = __rhs_00;
    local_d0 = p_Var15;
    if ((*(long *)(lVar12 + 0x48) == 0) ||
       (__p = __rhs_00,
       bVar5 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)(lVar12 + 0x40) + 0x20),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs_00), !bVar5)) {
LAB_00140bb3:
      pVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
               ::_M_get_insert_unique_pos(this_00,(key_type *)__rhs_00);
      __p = __rhs_00;
    }
    else {
      p_Var14 = *(_Base_ptr *)(lVar12 + 0x40);
LAB_00140ba9:
      auVar4._8_8_ = 0;
      auVar4._0_8_ = p_Var14;
      pVar16 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
    }
LAB_00140bbe:
    iVar8._M_node = pVar16.first;
    if (pVar16.second == (_Rb_tree_node_base *)0x0) {
LAB_00140bfe:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
      ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                      *)this,__p);
      goto LAB_00140c09;
    }
  }
  else {
    local_d8 = lVar12;
    __rhs = (_Link_type)(iVar8._M_node + 1);
    __p = __rhs;
    local_c8 = this_00;
    bVar5 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs);
    lVar12 = local_d8;
    if (!bVar5) {
      __p = __rhs_00;
      bVar5 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs_00);
      if (bVar5) {
        p_Var14 = *(_Base_ptr *)(local_d8 + 0x40);
        lVar12 = local_d8;
        local_e0 = __rhs_00;
        local_d0 = p_Var15;
        if (p_Var14 == iVar8._M_node) goto LAB_00140ba9;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar8._M_node);
        __p = local_e0;
        pVar16.second = p_Var10;
        pVar16.first = p_Var10;
        p_Var15 = (_Link_type)(p_Var10 + 1);
        bVar5 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)p_Var15);
        if (bVar5) {
          __p = p_Var15;
          lVar12 = local_d8;
          if ((iVar8._M_node)->_M_right == (_Base_ptr)0x0) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = iVar8._M_node;
            pVar16 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar3 << 0x40);
            goto LAB_00140bc9;
          }
        }
        else {
          pVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                   ::_M_get_insert_unique_pos(local_c8,(key_type *)__p);
          lVar12 = local_d8;
        }
        goto LAB_00140bbe;
      }
      goto LAB_00140bfe;
    }
    p_Var14 = *(_Base_ptr *)(local_d8 + 0x38);
    pVar16.second = p_Var14;
    pVar16.first = p_Var14;
    local_e0 = __rhs_00;
    local_d0 = p_Var15;
    if (p_Var14 == iVar8._M_node) goto LAB_00140bbe;
    uVar9 = std::_Rb_tree_decrement(iVar8._M_node);
    __rhs_00 = local_e0;
    __p = local_e0;
    bVar5 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (uVar9 + 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0);
    this_00 = local_c8;
    if (!bVar5) goto LAB_00140bb3;
    pVar16 = pVar1;
    if (*(long *)(uVar9 + 0x18) != 0) goto LAB_00140bbe;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    pVar16 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar2 << 0x40);
  }
LAB_00140bc9:
  p_Var15 = (_Link_type)pVar16.second;
  bVar5 = true;
  if ((local_d0 != p_Var15) && (pVar16.first == (_Rb_tree_node_base *)0x0)) {
    bVar5 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&p_Var15->_M_storage);
  }
  std::_Rb_tree_insert_and_rebalance
            (bVar5,this,(_Rb_tree_node_base *)p_Var15,&local_d0->super__Rb_tree_node_base);
  *(long *)(lVar12 + 0x48) = *(long *)(lVar12 + 0x48) + 1;
  iVar8._M_node = this;
LAB_00140c09:
  std::__cxx11::string::_M_assign((string *)(iVar8._M_node + 2));
  std::__cxx11::string::_M_assign((string *)(iVar8._M_node + 3));
  *(ulong *)(iVar8._M_node + 4) = CONCAT44(arg.flags,arg.type);
  pEVar11 = Environment::instance();
  (*(pEVar11->super_Counted)._vptr_Counted[4])(pEVar11,name,local_c0);
  lVar12 = std::__cxx11::string::find((char)name,0x3a);
  if (lVar12 == -1) {
    std::__cxx11::string::string((string *)&group,"global",(allocator *)&local_50);
  }
  else {
    std::__cxx11::string::substr((ulong)&group,(ulong)name);
  }
  iVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
                   *)(::(anonymous_namespace)::desc_ + 0x50),&group);
  if (iVar13._M_node == (_Base_ptr)(::(anonymous_namespace)::desc_ + 0x58)) {
    std::__cxx11::string::string((string *)&local_50,"CmdLine",&local_e1);
    poVar7 = Logger::err(&local_50);
    poVar7 = std::operator<<(poVar7,"Argument group does not exist: ");
    poVar7 = std::operator<<(poVar7,(string *)name);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iVar13._M_node[4]._M_parent,name);
  }
  std::__cxx11::string::~string((string *)&group);
  anon_unknown.dwarf_5db41::Arg::~Arg(&arg);
  return;
}

Assistant:

void declare_arg(
            const std::string& name,
            ArgType type,
            const std::string& default_value,
            const std::string& description,
            ArgFlags flags
        ) {
            if(desc_->args.find(name) != desc_->args.end()) {
                Logger::err("CmdLine")
                    << "Argument is multiply defined: " << name
                    << std::endl;
                return;
            }

            Arg arg;
            arg.name = name;
            arg.type = type;
            arg.desc = description;
            arg.flags = flags;
            desc_->args[name] = arg;

            Environment::instance()->set_value(name, default_value);

            std::string group = arg_group(name);
            auto it = desc_->groups.find(group);
            if(it == desc_->groups.end()) {
                Logger::err("CmdLine")
                    << "Argument group does not exist: " << name
                    << std::endl;
                return;
            }

            it->second.args.push_back(name);
        }